

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_gfx_enable_texture(uint id)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  rf_draw_call *prVar4;
  long lVar5;
  rf_vertex_buffer *prVar6;
  _Bool _Var7;
  uint v_count;
  long lVar8;
  rf_render_batch *prVar9;
  
  prVar9 = (rf__ctx->field_0).current_batch;
  lVar8 = prVar9->draw_calls_counter;
  prVar4 = prVar9->draw_calls;
  if (prVar4[lVar8 + -1].texture_id != id) {
    uVar3 = prVar4[lVar8 + -1].vertex_count;
    if (0 < (int)uVar3) {
      if (prVar4[lVar8 + -1].mode == RF_TRIANGLES) {
        v_count = 1;
        if (3 < uVar3) {
          v_count = 4 - (uVar3 & 3);
        }
      }
      else {
        v_count = 0;
        if (prVar4[lVar8 + -1].mode == RF_LINES) {
          v_count = uVar3 & 3;
        }
      }
      prVar4[lVar8 + -1].vertex_alignment = v_count;
      _Var7 = rf_gfx_check_buffer_limit(v_count);
      if (_Var7) {
        rf_gfx_draw();
        prVar9 = (rf__ctx->field_0).current_batch;
        lVar8 = prVar9->draw_calls_counter;
      }
      else {
        lVar5 = prVar9->current_buffer;
        prVar6 = prVar9->vertex_buffers;
        prVar6[lVar5].c_counter = prVar6[lVar5].c_counter + v_count;
        uVar1 = prVar6[lVar5].v_counter;
        uVar2 = prVar6[lVar5].tc_counter;
        prVar6[lVar5].v_counter = v_count + uVar1;
        prVar6[lVar5].tc_counter = v_count + uVar2;
        lVar8 = lVar8 + 1;
        prVar9->draw_calls_counter = lVar8;
      }
    }
    if (0xff < lVar8) {
      rf_gfx_draw();
      prVar9 = (rf__ctx->field_0).current_batch;
      lVar8 = prVar9->draw_calls_counter;
    }
    prVar4 = prVar9->draw_calls;
    prVar4[lVar8 + -1].texture_id = id;
    prVar4[lVar8 + -1].vertex_count = 0;
  }
  return;
}

Assistant:

RF_API void rf_gfx_enable_texture(unsigned int id)
{
    if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].texture_id != id)
    {
        if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count > 0)
        {
            // Make sure current rf_ctx->gl_ctx.draws[i].vertex_count is aligned a multiple of 4,
            // that way, following QUADS drawing will keep aligned with index processing
            // It implies adding some extra alignment vertex at the end of the draw,
            // those vertex are not processed but they are considered as an additional offset
            // for the next set of vertex to be drawn
            if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].mode == RF_LINES)
            {
                rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment = ((rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count < 4) ? rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count : rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count % 4);
            }
            else if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].mode == RF_TRIANGLES)
            {
                rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment = ((rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count < 4) ? 1 : (4 - (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count % 4)));
            }
            else
            {
                rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment = 0;
            }

            if (rf_gfx_check_buffer_limit(rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment))
            {
                rf_gfx_draw();
            }
            else
            {
                rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter += rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment;
                rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter += rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment;
                rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter += rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment;

                rf_batch.draw_calls_counter++;
            }
        }

        if (rf_batch.draw_calls_counter >= RF_DEFAULT_BATCH_DRAW_CALLS_COUNT)
        {
            rf_gfx_draw();
        }

        rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].texture_id = id;
        rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count = 0;
    }
}